

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_FindAndCountAndEqualRange_Test<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_FindAndCountAndEqualRange_Test<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator it_00;
  bool bVar1;
  key_type key;
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  key_type assertion_result;
  key_type expression_text;
  char *actual_predicate_value;
  AssertionResult gtest_ar__23;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar__22;
  AssertionResult gtest_ar__21;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar__20;
  AssertionResult gtest_ar__19;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar__18;
  AssertionResult gtest_ar__17;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar__16;
  AssertionResult gtest_ar__15;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar__14;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar__13;
  AssertionResult gtest_ar__12;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar__11;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar__10;
  AssertionResult gtest_ar__9;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar__8;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar__7;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar__4;
  TypeParam ht;
  AssertionResult gtest_ar_2;
  const_iterator it;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  pair<google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  const_eq_pair;
  pair<google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  eq_pair;
  type in_stack_ffffffffffffe058;
  type __p;
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffe060;
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_01;
  uint *in_stack_ffffffffffffe068;
  pair<int,_int> *lhs;
  undefined4 in_stack_ffffffffffffe070;
  undefined4 uVar2;
  int in_stack_ffffffffffffe074;
  int index;
  undefined4 in_stack_ffffffffffffe078;
  undefined4 uVar3;
  int in_stack_ffffffffffffe07c;
  int line;
  HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffe080;
  char *file;
  Type in_stack_ffffffffffffe08c;
  Type type;
  AssertHelper *in_stack_ffffffffffffe090;
  AssertHelper *this_02;
  undefined8 in_stack_ffffffffffffe0a8;
  nonempty_iterator in_stack_ffffffffffffe0b0;
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffe0b8;
  char *in_stack_ffffffffffffe0c0;
  char *in_stack_ffffffffffffe0c8;
  char *in_stack_ffffffffffffe0d0;
  AssertionResult *in_stack_ffffffffffffe0d8;
  AssertHelper *in_stack_ffffffffffffe0e0;
  AssertHelper *this_03;
  key_type *in_stack_ffffffffffffe0f8;
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffe100;
  value_type *in_stack_ffffffffffffe198;
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffe1a0;
  key_type *in_stack_ffffffffffffe278;
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffe280;
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_04;
  string local_1c80 [55];
  undefined1 local_1c49;
  AssertionResult local_1c48;
  key_type local_1c38;
  key_type local_1b80;
  char *local_1b78;
  undefined4 local_1b6c;
  AssertionResult local_1b68;
  string local_1b58 [128];
  key_type local_1ad8;
  undefined1 local_1a79;
  AssertionResult local_1a78;
  string local_1a68 [55];
  undefined1 local_1a31;
  AssertionResult local_1a30;
  key_type local_1a20;
  key_type local_1968;
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *local_1960;
  undefined4 local_1954;
  AssertionResult local_1950;
  string local_1940 [128];
  key_type local_18c0;
  undefined1 local_1861;
  AssertionResult local_1860;
  string local_1850 [55];
  undefined1 local_1819;
  AssertionResult local_1818;
  key_type local_1808;
  key_type local_1750;
  size_type local_1748;
  undefined4 local_173c;
  AssertionResult local_1738;
  string local_1728 [128];
  key_type local_16a8;
  undefined1 local_1649;
  AssertionResult local_1648;
  string local_1638 [55];
  undefined1 local_1601;
  AssertionResult local_1600;
  key_type local_15f0;
  key_type local_1538;
  size_type local_1530;
  undefined4 local_1524;
  AssertionResult local_1520;
  string local_1510 [128];
  key_type local_1490;
  undefined1 local_1431;
  AssertionResult local_1430;
  string local_1420 [55];
  undefined1 local_13e9;
  AssertionResult local_13e8 [2];
  key_type local_13c8;
  key_type local_13c0;
  AssertionResult local_13b8;
  string local_13a8 [55];
  undefined1 local_1371;
  AssertionResult local_1370;
  key_type local_1360;
  key_type local_12a8;
  size_type local_12a0;
  undefined4 local_1294;
  AssertionResult local_1290;
  string local_1280 [128];
  key_type local_1200;
  undefined1 local_11a1;
  AssertionResult local_11a0;
  string local_1190 [55];
  undefined1 local_1159;
  AssertionResult local_1158 [2];
  key_type local_1138;
  key_type local_1130;
  AssertionResult local_1128;
  string local_1118 [55];
  undefined1 local_10e1;
  AssertionResult local_10e0;
  key_type local_10d0;
  key_type local_1018;
  size_type local_1010;
  undefined4 local_1004;
  AssertionResult local_1000;
  string local_ff0 [128];
  key_type local_f70;
  undefined1 local_f11;
  AssertionResult local_f10;
  string local_f00 [55];
  undefined1 local_ec9;
  AssertionResult local_ec8 [2];
  key_type local_ea8;
  key_type local_ea0;
  AssertionResult local_e98;
  string local_e88 [55];
  undefined1 local_e51;
  AssertionResult local_e50;
  key_type local_e40;
  key_type local_d88;
  size_type local_d80;
  undefined4 local_d74;
  AssertionResult local_d70;
  string local_d60 [128];
  key_type local_ce0;
  undefined1 local_c81;
  AssertionResult local_c80;
  string local_c70 [55];
  undefined1 local_c39;
  AssertionResult local_c38 [2];
  key_type local_c18;
  key_type local_c10;
  AssertionResult local_c08;
  string local_bf8 [55];
  undefined1 local_bc1;
  AssertionResult local_bc0;
  key_type local_bb0;
  key_type local_af8;
  size_type local_af0;
  undefined4 local_ae4;
  AssertionResult local_ae0;
  string local_ad0 [128];
  key_type local_a50;
  undefined1 local_9f1;
  AssertionResult local_9f0 [12];
  key_type local_930;
  key_type local_928;
  AssertionResult local_920;
  key_type local_910;
  type local_908;
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pBStack_900;
  pair<int,_int> *local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  char *pcStack_8e0;
  undefined8 local_8d8;
  AssertHelper *pAStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  size_type local_858;
  undefined4 local_84c;
  AssertionResult local_848 [6];
  value_type local_7e0;
  pair<int,_int> local_7cc;
  int local_7c4;
  value_type local_768;
  pair<int,_int> local_758;
  int local_750;
  value_type local_6f0;
  pair<int,_int> local_6e0;
  int local_6d8;
  value_type local_678;
  pair<int,_int> local_668;
  int local_660;
  value_type local_600;
  pair<int,_int> local_5f0;
  int local_5e8;
  value_type local_588;
  pair<int,_int> local_578;
  int local_570;
  value_type local_510;
  pair<int,_int> local_500;
  int local_4f8;
  value_type local_498;
  pair<int,_int> local_488;
  int local_480;
  string local_478 [55];
  byte local_441;
  AssertionResult local_440 [6];
  value_type local_3d8;
  pair<int,_int> local_3c4;
  int local_3bc;
  string local_3b8 [55];
  undefined1 local_381;
  AssertionResult local_380;
  key_type local_370;
  key_type local_2b8;
  size_type local_2b0;
  undefined4 local_2a4;
  AssertionResult local_2a0;
  string local_290 [128];
  key_type local_210;
  undefined1 local_1b1;
  AssertionResult local_1b0;
  string local_1a0 [71];
  undefined1 local_159;
  AssertionResult local_158;
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_148;
  AssertHelper local_a8 [21];
  
  std::
  pair<google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::
  pair<google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_true>
            ((pair<google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
              *)in_stack_ffffffffffffe060);
  std::
  pair<google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::
  pair<google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_true>
            ((pair<google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
              *)in_stack_ffffffffffffe060);
  local_159 = google::
              BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::empty((BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)0xd84caa);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffe060,(bool *)in_stack_ffffffffffffe058,
             (type *)0xd84ccc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_158);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe090);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0c8,
               in_stack_ffffffffffffe0c0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe090,in_stack_ffffffffffffe08c,(char *)in_stack_ffffffffffffe080
               ,in_stack_ffffffffffffe07c,
               (char *)CONCAT44(in_stack_ffffffffffffe074,in_stack_ffffffffffffe070));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe060);
    std::__cxx11::string::~string(local_1a0);
    testing::Message::~Message((Message *)0xd84d8d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd84e24);
  local_210 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_ffffffffffffe07c,in_stack_ffffffffffffe078),
                          in_stack_ffffffffffffe074);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffe100,in_stack_ffffffffffffe0f8);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffe100);
  local_1b1 = google::
              sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)in_stack_ffffffffffffe060,(iterator *)in_stack_ffffffffffffe058);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffe060,(bool *)in_stack_ffffffffffffe058,
             (type *)0xd84eba);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe090);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0c8,
               in_stack_ffffffffffffe0c0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe090,in_stack_ffffffffffffe08c,(char *)in_stack_ffffffffffffe080
               ,in_stack_ffffffffffffe07c,
               (char *)CONCAT44(in_stack_ffffffffffffe074,in_stack_ffffffffffffe070));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe060);
    std::__cxx11::string::~string(local_290);
    testing::Message::~Message((Message *)0xd84f8d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd85024);
  local_2a4 = 0;
  local_2b8 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_ffffffffffffe07c,in_stack_ffffffffffffe078),
                          in_stack_ffffffffffffe074);
  local_2b0 = google::
              BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(in_stack_ffffffffffffe060,(key_type *)in_stack_ffffffffffffe058);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffe07c,in_stack_ffffffffffffe078),
             (char *)CONCAT44(in_stack_ffffffffffffe074,in_stack_ffffffffffffe070),
             in_stack_ffffffffffffe068,(unsigned_long *)in_stack_ffffffffffffe060);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe090);
    testing::AssertionResult::failure_message((AssertionResult *)0xd850e6);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe090,in_stack_ffffffffffffe08c,(char *)in_stack_ffffffffffffe080
               ,in_stack_ffffffffffffe07c,
               (char *)CONCAT44(in_stack_ffffffffffffe074,in_stack_ffffffffffffe070));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe060);
    testing::Message::~Message((Message *)0xd85149);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd851ba);
  local_370 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_ffffffffffffe07c,in_stack_ffffffffffffe078),
                          in_stack_ffffffffffffe074);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(in_stack_ffffffffffffe280,in_stack_ffffffffffffe278);
  std::
  pair<google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
               *)in_stack_ffffffffffffe060,in_stack_ffffffffffffe058);
  local_381 = google::
              sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)in_stack_ffffffffffffe060,(iterator *)in_stack_ffffffffffffe058);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffe060,(bool *)in_stack_ffffffffffffe058,
             (type *)0xd85250);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_380);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe090);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0c8,
               in_stack_ffffffffffffe0c0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe090,in_stack_ffffffffffffe08c,(char *)in_stack_ffffffffffffe080
               ,in_stack_ffffffffffffe07c,
               (char *)CONCAT44(in_stack_ffffffffffffe074,in_stack_ffffffffffffe070));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe060);
    std::__cxx11::string::~string(local_3b8);
    testing::Message::~Message((Message *)0xd85323);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd853ba);
  local_3d8 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffe080,in_stack_ffffffffffffe07c);
  local_3c4 = local_3d8.first;
  local_3bc = local_3d8.second;
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffe1a0,in_stack_ffffffffffffe198);
  bVar1 = google::
          BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::empty((BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   *)0xd85436);
  local_441 = (bVar1 ^ 0xffU) & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffe060,(bool *)in_stack_ffffffffffffe058,
             (type *)0xd8545a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_440);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe090);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0c8,
               in_stack_ffffffffffffe0c0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe090,in_stack_ffffffffffffe08c,(char *)in_stack_ffffffffffffe080
               ,in_stack_ffffffffffffe07c,
               (char *)CONCAT44(in_stack_ffffffffffffe074,in_stack_ffffffffffffe070));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe060);
    std::__cxx11::string::~string(local_478);
    testing::Message::~Message((Message *)0xd8552d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd855c4);
  local_498 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffe080,in_stack_ffffffffffffe07c);
  local_480 = local_498.second;
  local_488 = local_498.first;
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffe1a0,in_stack_ffffffffffffe198);
  local_510 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffe080,in_stack_ffffffffffffe07c);
  local_4f8 = local_510.second;
  local_500 = local_510.first;
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffe1a0,in_stack_ffffffffffffe198);
  local_588 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffe080,in_stack_ffffffffffffe07c);
  local_570 = local_588.second;
  local_578 = local_588.first;
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffe1a0,in_stack_ffffffffffffe198);
  local_600 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffe080,in_stack_ffffffffffffe07c);
  local_5e8 = local_600.second;
  local_5f0 = local_600.first;
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffe1a0,in_stack_ffffffffffffe198);
  local_678 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffe080,in_stack_ffffffffffffe07c);
  local_660 = local_678.second;
  local_668 = local_678.first;
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffe1a0,in_stack_ffffffffffffe198);
  local_6f0 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffe080,in_stack_ffffffffffffe07c);
  local_6d8 = local_6f0.second;
  local_6e0 = local_6f0.first;
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffe1a0,in_stack_ffffffffffffe198);
  local_768 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffe080,in_stack_ffffffffffffe07c);
  local_750 = local_768.second;
  local_758 = local_768.first;
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffe1a0,in_stack_ffffffffffffe198);
  local_7e0 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffe080,in_stack_ffffffffffffe07c);
  local_7cc = local_7e0.first;
  local_7c4 = local_7e0.second;
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffe1a0,in_stack_ffffffffffffe198);
  local_84c = 9;
  local_858 = google::
              BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xd858cf);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffe07c,in_stack_ffffffffffffe078),
             (char *)CONCAT44(in_stack_ffffffffffffe074,in_stack_ffffffffffffe070),
             in_stack_ffffffffffffe068,(unsigned_long *)in_stack_ffffffffffffe060);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_848);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe090);
    testing::AssertionResult::failure_message((AssertionResult *)0xd85948);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe090,in_stack_ffffffffffffe08c,(char *)in_stack_ffffffffffffe080
               ,in_stack_ffffffffffffe07c,
               (char *)CONCAT44(in_stack_ffffffffffffe074,in_stack_ffffffffffffe070));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe060);
    testing::Message::~Message((Message *)0xd859ab);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd85a1c);
  local_910 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_ffffffffffffe07c,in_stack_ffffffffffffe078),
                          in_stack_ffffffffffffe074);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffe100,in_stack_ffffffffffffe0f8);
  type = (Type)((ulong)local_8d8 >> 0x20);
  uVar3 = (undefined4)local_8e8;
  line = (int)((ulong)local_8e8 >> 0x20);
  uVar2 = (undefined4)uStack_8f0;
  index = (int)((ulong)uStack_8f0 >> 0x20);
  it_00.super_iterator.pos.row_begin._M_current._0_4_ = uVar3;
  it_00.super_iterator.ht =
       (sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)uStack_8f0;
  it_00.super_iterator.pos.row_begin._M_current._4_4_ = line;
  it_00.super_iterator.pos.row_end._M_current =
       (sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)pcStack_8e0;
  it_00.super_iterator.pos.row_current._M_current._0_4_ = (int)local_8d8;
  it_00.super_iterator.pos.row_current._M_current._4_4_ = type;
  it_00.super_iterator.pos.col_current = (nonempty_iterator)pAStack_8d0;
  it_00.super_iterator.end.row_begin._M_current =
       (sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)local_8c8;
  it_00.super_iterator.end.row_end._M_current =
       (sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)uStack_8c0;
  it_00.super_iterator.end.row_current._M_current =
       (sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_ffffffffffffe0a8;
  it_00.super_iterator.end.col_current = in_stack_ffffffffffffe0b0;
  it_00.parent_ = in_stack_ffffffffffffe0b8;
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_iterator::const_iterator((const_iterator *)pBStack_900,it_00);
  local_928 = google::
              BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::const_iterator::key(&local_908->first);
  local_930 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(line,uVar3),index);
  testing::internal::EqHelper::Compare<std::pair<int,_int>,_std::pair<int,_int>,_nullptr>
            ((char *)CONCAT44(line,uVar3),(char *)CONCAT44(index,uVar2),local_8f8,
             (pair<int,_int> *)pBStack_900);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_920);
  __p = local_908;
  this_01 = pBStack_900;
  lhs = local_8f8;
  file = pcStack_8e0;
  this_02 = pAStack_8d0;
  if (!bVar1) {
    testing::Message::Message((Message *)pAStack_8d0);
    testing::AssertionResult::failure_message((AssertionResult *)0xd85b4d);
    testing::internal::AssertHelper::AssertHelper
              (pAStack_8d0,type,pcStack_8e0,line,(char *)CONCAT44(index,uVar2));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pBStack_900);
    testing::Message::~Message((Message *)0xd85bb0);
    __p = local_908;
    this_01 = pBStack_900;
    lhs = local_8f8;
    file = pcStack_8e0;
    this_02 = pAStack_8d0;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd85c21);
  google::
  HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)this_01,
             (HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)__p);
  local_a50 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(line,uVar3),index);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffe100,in_stack_ffffffffffffe0f8);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffe100);
  local_9f1 = google::
              sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)this_01,(iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_01,(bool *)__p,(type *)0xd85cef);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_9f0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0c8,
               in_stack_ffffffffffffe0c0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,file,line,(char *)CONCAT44(index,uVar2));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_ad0);
    testing::Message::~Message((Message *)0xd85ddd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd85e74);
  local_ae4 = 1;
  local_af8 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(line,uVar3),index);
  local_af0 = google::
              BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(this_01,(key_type *)__p);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(line,uVar3),(char *)CONCAT44(index,uVar2),(uint *)lhs,
             (unsigned_long *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_ae0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::AssertionResult::failure_message((AssertionResult *)0xd85f5c);
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,file,line,(char *)CONCAT44(index,uVar2));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0xd85fbf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd86030);
  local_bb0 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(line,uVar3),index);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(in_stack_ffffffffffffe280,in_stack_ffffffffffffe278);
  std::
  pair<google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
               *)this_01,(type)__p);
  local_bc1 = google::
              sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)this_01,(iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_01,(bool *)__p,(type *)0xd860ee);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_bc0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0c8,
               in_stack_ffffffffffffe0c0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,file,line,(char *)CONCAT44(index,uVar2));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_bf8);
    testing::Message::~Message((Message *)0xd861c3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd8625a);
  local_c10 = google::
              BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::iterator::key((iterator *)__p);
  local_c18 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(line,uVar3),index);
  testing::internal::EqHelper::Compare<std::pair<int,_int>,_std::pair<int,_int>,_nullptr>
            ((char *)CONCAT44(line,uVar3),(char *)CONCAT44(index,uVar2),lhs,
             (pair<int,_int> *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c08);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::AssertionResult::failure_message((AssertionResult *)0xd86320);
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,file,line,(char *)CONCAT44(index,uVar2));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0xd86383);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd863f1);
  google::
  sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)this_01);
  local_c39 = google::
              sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)this_01,(iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_01,(bool *)__p,(type *)0xd86435);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c38);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0c8,
               in_stack_ffffffffffffe0c0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,file,line,(char *)CONCAT44(index,uVar2));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_c70);
    testing::Message::~Message((Message *)0xd8650a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd865a1);
  local_ce0 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(line,uVar3),index);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffe100,in_stack_ffffffffffffe0f8);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffe100);
  local_c81 = google::
              sparse_hashtable_const_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((sparse_hashtable_const_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)this_01,(const_iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_01,(bool *)__p,(type *)0xd8664a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c80);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0c8,
               in_stack_ffffffffffffe0c0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,file,line,(char *)CONCAT44(index,uVar2));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_d60);
    testing::Message::~Message((Message *)0xd8671f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd867b6);
  local_d74 = 1;
  local_d88 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(line,uVar3),index);
  local_d80 = google::
              BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(this_01,(key_type *)__p);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(line,uVar3),(char *)CONCAT44(index,uVar2),(uint *)lhs,
             (unsigned_long *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d70);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::AssertionResult::failure_message((AssertionResult *)0xd8688f);
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,file,line,(char *)CONCAT44(index,uVar2));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0xd868f2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd86963);
  local_e40 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(line,uVar3),index);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(in_stack_ffffffffffffe280,in_stack_ffffffffffffe278);
  this_04 = &local_148;
  std::
  pair<google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
               *)this_01,__p);
  local_e51 = google::
              sparse_hashtable_const_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((sparse_hashtable_const_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)this_01,(const_iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_01,(bool *)__p,(type *)0xd86a12);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e50);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0c8,
               in_stack_ffffffffffffe0c0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,file,line,(char *)CONCAT44(index,uVar2));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_e88);
    testing::Message::~Message((Message *)0xd86ae7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd86b7e);
  key = google::
        BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        ::const_iterator::key(&__p->first);
  local_ea0 = key;
  local_ea8 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(line,uVar3),index);
  testing::internal::EqHelper::Compare<std::pair<int,_int>,_std::pair<int,_int>,_nullptr>
            ((char *)CONCAT44(line,uVar3),(char *)CONCAT44(index,uVar2),lhs,
             (pair<int,_int> *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e98);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::AssertionResult::failure_message((AssertionResult *)0xd86c44);
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,file,line,(char *)CONCAT44(index,uVar2));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0xd86ca7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd86d15);
  google::
  sparse_hashtable_const_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((sparse_hashtable_const_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)this_01);
  local_ec9 = google::
              sparse_hashtable_const_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((sparse_hashtable_const_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)this_01,(const_iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_01,(bool *)__p,(type *)0xd86d59);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_ec8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0c8,
               in_stack_ffffffffffffe0c0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,file,line,(char *)CONCAT44(index,uVar2));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_f00);
    testing::Message::~Message((Message *)0xd86e2e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd86ec5);
  local_f70 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(line,uVar3),index);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffe100,in_stack_ffffffffffffe0f8);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffe100);
  local_f11 = google::
              sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)this_01,(iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_01,(bool *)__p,(type *)0xd86f81);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f10);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0c8,
               in_stack_ffffffffffffe0c0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,file,line,(char *)CONCAT44(index,uVar2));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_ff0);
    testing::Message::~Message((Message *)0xd87056);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd870ed);
  local_1004 = 1;
  local_1018 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(line,uVar3),index);
  local_1010 = google::
               BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::count(this_01,(key_type *)__p);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(line,uVar3),(char *)CONCAT44(index,uVar2),(uint *)lhs,
             (unsigned_long *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1000);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::AssertionResult::failure_message((AssertionResult *)0xd871d5);
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,file,line,(char *)CONCAT44(index,uVar2));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0xd87238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd872a9);
  local_10d0 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(line,uVar3),index);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(this_04,(key_type *)key);
  std::
  pair<google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
               *)this_01,(type)__p);
  local_10e1 = google::
               sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator!=((sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)this_01,(iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_01,(bool *)__p,(type *)0xd87367);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_10e0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0c8,
               in_stack_ffffffffffffe0c0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,file,line,(char *)CONCAT44(index,uVar2));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_1118);
    testing::Message::~Message((Message *)0xd8743c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd874d3);
  local_1130 = google::
               BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::iterator::key((iterator *)__p);
  local_1138 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(line,uVar3),index);
  testing::internal::EqHelper::Compare<std::pair<int,_int>,_std::pair<int,_int>,_nullptr>
            ((char *)CONCAT44(line,uVar3),(char *)CONCAT44(index,uVar2),lhs,
             (pair<int,_int> *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1128);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::AssertionResult::failure_message((AssertionResult *)0xd87599);
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,file,line,(char *)CONCAT44(index,uVar2));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0xd875fc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd8766a);
  google::
  sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)this_01);
  local_1159 = google::
               sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)this_01,(iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_01,(bool *)__p,(type *)0xd876ae);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1158);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0c8,
               in_stack_ffffffffffffe0c0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,file,line,(char *)CONCAT44(index,uVar2));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_1190);
    testing::Message::~Message((Message *)0xd87783);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd8781a);
  local_1200 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(line,uVar3),index);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffe100,in_stack_ffffffffffffe0f8);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffe100);
  local_11a1 = google::
               sparse_hashtable_const_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator!=((sparse_hashtable_const_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)this_01,(const_iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_01,(bool *)__p,(type *)0xd878c3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_11a0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0c8,
               in_stack_ffffffffffffe0c0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,file,line,(char *)CONCAT44(index,uVar2));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_1280);
    testing::Message::~Message((Message *)0xd87998);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd87a2f);
  local_1294 = 1;
  local_12a8 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(line,uVar3),index);
  local_12a0 = google::
               BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::count(this_01,(key_type *)__p);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(line,uVar3),(char *)CONCAT44(index,uVar2),(uint *)lhs,
             (unsigned_long *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1290);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::AssertionResult::failure_message((AssertionResult *)0xd87b08);
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,file,line,(char *)CONCAT44(index,uVar2));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0xd87b6b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd87bdc);
  local_1360 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(line,uVar3),index);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(this_04,(key_type *)key);
  std::
  pair<google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
               *)this_01,__p);
  local_1371 = google::
               sparse_hashtable_const_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator!=((sparse_hashtable_const_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)this_01,(const_iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_01,(bool *)__p,(type *)0xd87c8b);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1370);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0c8,
               in_stack_ffffffffffffe0c0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,file,line,(char *)CONCAT44(index,uVar2));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_13a8);
    testing::Message::~Message((Message *)0xd87d60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd87df7);
  local_13c0 = google::
               BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::const_iterator::key(&__p->first);
  local_13c8 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(line,uVar3),index);
  testing::internal::EqHelper::Compare<std::pair<int,_int>,_std::pair<int,_int>,_nullptr>
            ((char *)CONCAT44(line,uVar3),(char *)CONCAT44(index,uVar2),lhs,
             (pair<int,_int> *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_13b8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::AssertionResult::failure_message((AssertionResult *)0xd87ebd);
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,file,line,(char *)CONCAT44(index,uVar2));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0xd87f20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd87f8e);
  google::
  sparse_hashtable_const_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((sparse_hashtable_const_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)this_01);
  local_13e9 = google::
               sparse_hashtable_const_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((sparse_hashtable_const_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)this_01,(const_iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_01,(bool *)__p,(type *)0xd87fd2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_13e8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0c8,
               in_stack_ffffffffffffe0c0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,file,line,(char *)CONCAT44(index,uVar2));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_1420);
    testing::Message::~Message((Message *)0xd880a7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd8813e);
  local_1490 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(line,uVar3),index);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffe100,in_stack_ffffffffffffe0f8);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffe100);
  local_1431 = google::
               sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)this_01,(iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_01,(bool *)__p,(type *)0xd881e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1430);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0c8,
               in_stack_ffffffffffffe0c0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,file,line,(char *)CONCAT44(index,uVar2));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_1510);
    testing::Message::~Message((Message *)0xd882bd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd88354);
  local_1524 = 0;
  local_1538 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(line,uVar3),index);
  local_1530 = google::
               BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::count(this_01,(key_type *)__p);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(line,uVar3),(char *)CONCAT44(index,uVar2),(uint *)lhs,
             (unsigned_long *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1520);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::AssertionResult::failure_message((AssertionResult *)0xd8843c);
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,file,line,(char *)CONCAT44(index,uVar2));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0xd8849f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd88510);
  local_15f0 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(line,uVar3),index);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(this_04,(key_type *)key);
  std::
  pair<google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
               *)this_01,(type)__p);
  local_1601 = google::
               sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)this_01,(iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_01,(bool *)__p,(type *)0xd885bc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1600);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0c8,
               in_stack_ffffffffffffe0c0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,file,line,(char *)CONCAT44(index,uVar2));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_1638);
    testing::Message::~Message((Message *)0xd88691);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd88728);
  local_16a8 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(line,uVar3),index);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffe100,in_stack_ffffffffffffe0f8);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffe100);
  local_1649 = google::
               sparse_hashtable_const_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((sparse_hashtable_const_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)this_01,(const_iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_01,(bool *)__p,(type *)0xd887bf);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1648);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0c8,
               in_stack_ffffffffffffe0c0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,file,line,(char *)CONCAT44(index,uVar2));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_1728);
    testing::Message::~Message((Message *)0xd88894);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd8892b);
  local_173c = 0;
  local_1750 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(line,uVar3),index);
  local_1748 = google::
               BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::count(this_01,(key_type *)__p);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(line,uVar3),(char *)CONCAT44(index,uVar2),(uint *)lhs,
             (unsigned_long *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1738);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::AssertionResult::failure_message((AssertionResult *)0xd88a04);
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,file,line,(char *)CONCAT44(index,uVar2));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0xd88a67);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd88ad8);
  local_1808 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(line,uVar3),index);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(this_04,(key_type *)key);
  std::
  pair<google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
               *)this_01,__p);
  local_1819 = google::
               sparse_hashtable_const_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((sparse_hashtable_const_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)this_01,(const_iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_01,(bool *)__p,(type *)0xd88b75);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1818);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0c8,
               in_stack_ffffffffffffe0c0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,file,line,(char *)CONCAT44(index,uVar2));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_1850);
    testing::Message::~Message((Message *)0xd88c4a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd88ce1);
  local_18c0 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(line,uVar3),index);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffe100,in_stack_ffffffffffffe0f8);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffe100);
  local_1861 = google::
               sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)this_01,(iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_01,(bool *)__p,(type *)0xd88d8b);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1860);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0c8,
               in_stack_ffffffffffffe0c0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,file,line,(char *)CONCAT44(index,uVar2));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_1940);
    testing::Message::~Message((Message *)0xd88e60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd88ef7);
  local_1954 = 0;
  local_1968 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(line,uVar3),index);
  this_00 = (BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)google::
               BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::count(this_01,(key_type *)__p);
  local_1960 = this_00;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(line,uVar3),(char *)CONCAT44(index,uVar2),(uint *)lhs,
             (unsigned_long *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1950);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    in_stack_ffffffffffffe0f8 =
         (key_type *)testing::AssertionResult::failure_message((AssertionResult *)0xd88fdf);
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,file,line,(char *)CONCAT44(index,uVar2));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe0e0,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0xd89042);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd890b3);
  local_1a20 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(line,uVar3),index);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(this_04,(key_type *)key);
  this_03 = local_a8;
  std::
  pair<google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
               *)this_01,(type)__p);
  local_1a31 = google::
               sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)this_01,(iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_01,(bool *)__p,(type *)0xd8915f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a30);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0c8,
               in_stack_ffffffffffffe0c0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,file,line,(char *)CONCAT44(index,uVar2));
    testing::internal::AssertHelper::operator=(this_03,(Message *)in_stack_ffffffffffffe0d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_1a68);
    testing::Message::~Message((Message *)0xd89234);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd892cb);
  assertion_result =
       HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    *)CONCAT44(line,uVar3),index);
  local_1ad8 = assertion_result;
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(this_00,in_stack_ffffffffffffe0f8);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(this_00);
  local_1a79 = google::
               sparse_hashtable_const_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((sparse_hashtable_const_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)this_01,(const_iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_01,(bool *)__p,(type *)0xd89362);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a78);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)assertion_result,in_stack_ffffffffffffe0d0,
               in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,file,line,(char *)CONCAT44(index,uVar2));
    testing::internal::AssertHelper::operator=(this_03,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_1b58);
    testing::Message::~Message((Message *)0xd89437);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd894ce);
  local_1b6c = 0;
  expression_text =
       HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    *)CONCAT44(line,uVar3),index);
  local_1b80 = expression_text;
  actual_predicate_value =
       (char *)google::
               BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::count(this_01,(key_type *)__p);
  local_1b78 = actual_predicate_value;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(line,uVar3),(char *)CONCAT44(index,uVar2),(uint *)lhs,
             (unsigned_long *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b68);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    in_stack_ffffffffffffe0c0 =
         testing::AssertionResult::failure_message((AssertionResult *)0xd8959b);
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,file,line,(char *)CONCAT44(index,uVar2));
    testing::internal::AssertHelper::operator=(this_03,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0xd895f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd89669);
  local_1c38 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(line,uVar3),index);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(this_04,(key_type *)key);
  std::
  pair<google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
               *)this_01,__p);
  local_1c49 = google::
               sparse_hashtable_const_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((sparse_hashtable_const_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)this_01,(const_iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_01,(bool *)__p,(type *)0xd896fa);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c48);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)assertion_result,(char *)expression_text,actual_predicate_value,
               in_stack_ffffffffffffe0c0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,file,line,(char *)CONCAT44(index,uVar2));
    testing::internal::AssertHelper::operator=(this_03,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_1c80);
    testing::Message::~Message((Message *)0xd897cf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd89863);
  google::
  HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xd89870);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, FindAndCountAndEqualRange) {
  pair<typename TypeParam::iterator, typename TypeParam::iterator> eq_pair;
  pair<typename TypeParam::const_iterator, typename TypeParam::const_iterator>
      const_eq_pair;

  EXPECT_TRUE(this->ht_.empty());
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(1)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(1)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  this->ht_.insert(this->UniqueObject(1));
  EXPECT_FALSE(this->ht_.empty());
  this->ht_.insert(this->UniqueObject(11));
  this->ht_.insert(this->UniqueObject(111));
  this->ht_.insert(this->UniqueObject(1111));
  this->ht_.insert(this->UniqueObject(11111));
  this->ht_.insert(this->UniqueObject(111111));
  this->ht_.insert(this->UniqueObject(1111111));
  this->ht_.insert(this->UniqueObject(11111111));
  this->ht_.insert(this->UniqueObject(111111111));
  EXPECT_EQ(9u, this->ht_.size());
  typename TypeParam::const_iterator it = this->ht_.find(this->UniqueKey(1));
  EXPECT_EQ(it.key(), this->UniqueKey(1));

  // Allow testing the const version of the methods as well.
  const TypeParam ht = this->ht_;

  // Some successful lookups (via find, count, and equal_range).
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(1)) != this->ht_.end());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(1)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(eq_pair.first != eq_pair.second);
  EXPECT_EQ(eq_pair.first.key(), this->UniqueKey(1));
  ++eq_pair.first;
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(1)) != ht.end());
  EXPECT_EQ(1u, ht.count(this->UniqueKey(1)));
  const_eq_pair = ht.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(const_eq_pair.first != const_eq_pair.second);
  EXPECT_EQ(const_eq_pair.first.key(), this->UniqueKey(1));
  ++const_eq_pair.first;
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11111)) != this->ht_.end());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(11111)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11111));
  EXPECT_TRUE(eq_pair.first != eq_pair.second);
  EXPECT_EQ(eq_pair.first.key(), this->UniqueKey(11111));
  ++eq_pair.first;
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11111)) != ht.end());
  EXPECT_EQ(1u, ht.count(this->UniqueKey(11111)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11111));
  EXPECT_TRUE(const_eq_pair.first != const_eq_pair.second);
  EXPECT_EQ(const_eq_pair.first.key(), this->UniqueKey(11111));
  ++const_eq_pair.first;
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  // Some unsuccessful lookups (via find, count, and equal_range).
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11112)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(11112)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11112));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11112)) == ht.end());
  EXPECT_EQ(0u, ht.count(this->UniqueKey(11112)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11112));
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11110)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(11110)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11110));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11110)) == ht.end());
  EXPECT_EQ(0u, ht.count(this->UniqueKey(11110)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11110));
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);
}